

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O0

ares_htable_strvp_t * ares_htable_strvp_create(ares_htable_strvp_val_free_t val_free)

{
  ares_htable_strvp_t *ptr;
  ares_htable_t *paVar1;
  ares_htable_strvp_t *htable;
  ares_htable_strvp_val_free_t val_free_local;
  
  ptr = (ares_htable_strvp_t *)ares_malloc(0x10);
  if (ptr != (ares_htable_strvp_t *)0x0) {
    paVar1 = ares_htable_create(hash_func,bucket_key,bucket_free,key_eq);
    ptr->hash = paVar1;
    if (ptr->hash != (ares_htable_t *)0x0) {
      ptr->free_val = val_free;
      return ptr;
    }
  }
  if (ptr != (ares_htable_strvp_t *)0x0) {
    ares_htable_destroy(ptr->hash);
    ares_free(ptr);
  }
  return (ares_htable_strvp_t *)0x0;
}

Assistant:

ares_htable_strvp_t *
  ares_htable_strvp_create(ares_htable_strvp_val_free_t val_free)
{
  ares_htable_strvp_t *htable = ares_malloc(sizeof(*htable));
  if (htable == NULL) {
    goto fail;
  }

  htable->hash = ares_htable_create(hash_func, bucket_key, bucket_free, key_eq);
  if (htable->hash == NULL) {
    goto fail;
  }

  htable->free_val = val_free;

  return htable;

fail:
  if (htable) {
    ares_htable_destroy(htable->hash);
    ares_free(htable);
  }
  return NULL;
}